

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O1

void __thiscall imrt::Collimator::generateReference(Collimator *this)

{
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *this_00;
  int iVar1;
  mapped_type *pmVar2;
  int iVar3;
  int iVar4;
  int i;
  key_type_conflict local_38 [2];
  
  this_00 = &this->reference;
  local_38[0] = 0;
  local_38[1] = 0;
  pmVar2 = std::
           map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
           ::operator[](this_00,local_38 + 1);
  pmVar2->first = -1;
  pmVar2->second = -1;
  local_38[0] = 1;
  iVar3 = this->ydim;
  if (1 < iVar3) {
    iVar4 = 1;
    do {
      if (iVar4 < this->ydim) {
        iVar3 = 0;
        do {
          pmVar2 = std::
                   map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                   ::operator[](this_00,local_38);
          pmVar2->first = iVar3;
          pmVar2->second = iVar4 + iVar3;
          local_38[0] = local_38[0] + 1;
          iVar1 = iVar4 + iVar3;
          iVar3 = iVar3 + 1;
        } while (iVar1 + 1 < this->ydim);
      }
      iVar4 = iVar4 + 1;
      iVar3 = this->ydim;
    } while (iVar4 < iVar3);
  }
  pmVar2 = std::
           map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
           ::operator[](this_00,local_38);
  pmVar2->first = 0;
  pmVar2->second = iVar3 + -1;
  this->ref_size = local_38[0];
  return;
}

Assistant:

void Collimator::generateReference () {
    int i = 0;
    reference[0] = make_pair(-1,-1);
    i = 1;
    for (int s = 1; s < getYdim(); s++) {
      for (int j = 0; (j+s) < getYdim(); j++) {
        reference[i] = make_pair(j,j+s);
        i++;
      }
    }
    reference[i] = make_pair(0, getYdim()-1);
    ref_size = i;
  }